

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

TwoWayPipe * kj::newTwoWayPipe(void)

{
  AsyncPipe *pAVar1;
  Refcounted *refcounted_1;
  TwoWayPipe *in_RDI;
  Refcounted *refcounted;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> OVar2;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> end2;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> pipe2;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> pipe1;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> end1;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_80;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_70;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_60;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_50;
  Disposer *local_40;
  AsyncIoStream *local_38;
  
  pAVar1 = (AsyncPipe *)operator_new(0x68);
  (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)0x0;
  (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)0x0;
  (pAVar1->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(pAVar1->super_Refcounted).refcount = 0;
  (pAVar1->ownState).ptr = (AsyncCapabilityStream *)0x0;
  *(undefined8 *)&pAVar1->readAborted = 0;
  (pAVar1->state).ptr = (AsyncCapabilityStream *)0x0;
  (pAVar1->ownState).disposer = (Disposer *)0x0;
  *(undefined8 *)&(pAVar1->readAbortPromise).ptr = 0;
  (pAVar1->readAbortPromise).ptr.field_1.value.hub.disposer = (Disposer *)0x0;
  (pAVar1->readAbortFulfiller).ptr.disposer = (Disposer *)0x0;
  (pAVar1->readAbortFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (pAVar1->readAbortPromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
  (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_00709d20;
  (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_0070a4b0;
  (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&PTR_write_0070a580;
  (pAVar1->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0070a5b0
  ;
  *(undefined8 *)((long)&(pAVar1->ownState).disposer + 1) = 0;
  *(undefined8 *)((long)&(pAVar1->ownState).ptr + 1) = 0;
  (pAVar1->readAbortPromise).ptr.isSet = false;
  (pAVar1->super_Refcounted).refcount = 1;
  local_60.disposer = &(pAVar1->super_Refcounted).super_Disposer;
  local_60.ptr = pAVar1;
  local_70.ptr = (AsyncPipe *)operator_new(0x68);
  ((local_70.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)0x0;
  ((local_70.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)0x0;
  ((local_70.ptr)->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&((local_70.ptr)->super_Refcounted).refcount = 0;
  ((local_70.ptr)->ownState).ptr = (AsyncCapabilityStream *)0x0;
  *(undefined8 *)&(local_70.ptr)->readAborted = 0;
  ((local_70.ptr)->state).ptr = (AsyncCapabilityStream *)0x0;
  ((local_70.ptr)->ownState).disposer = (Disposer *)0x0;
  *(undefined8 *)&((local_70.ptr)->readAbortPromise).ptr = 0;
  ((local_70.ptr)->readAbortPromise).ptr.field_1.value.hub.disposer = (Disposer *)0x0;
  ((local_70.ptr)->readAbortFulfiller).ptr.disposer = (Disposer *)0x0;
  ((local_70.ptr)->readAbortFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  ((local_70.ptr)->readAbortPromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
  local_70.disposer = &((local_70.ptr)->super_Refcounted).super_Disposer;
  ((local_70.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_0070a4b0;
  ((local_70.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&PTR_write_0070a580;
  ((local_70.ptr)->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_0070a5b0;
  *(undefined8 *)((long)&((local_70.ptr)->ownState).disposer + 1) = 0;
  *(undefined8 *)((long)&((local_70.ptr)->ownState).ptr + 1) = 0;
  ((local_70.ptr)->readAbortPromise).ptr.isSet = false;
  ((local_70.ptr)->super_Refcounted).refcount = 1;
  (pAVar1->super_Refcounted).refcount = 2;
  ((local_70.ptr)->super_Refcounted).refcount = 2;
  local_80.disposer = &(pAVar1->super_Refcounted).super_Disposer;
  local_80.ptr = pAVar1;
  local_50.disposer = local_70.disposer;
  local_50.ptr = local_70.ptr;
  OVar2 = heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
                    ((kj *)&local_40,&local_80,&local_50);
  pAVar1 = local_50.ptr;
  if (local_50.ptr != (AsyncPipe *)0x0) {
    local_50.ptr = (AsyncPipe *)0x0;
    (**((Disposer *)&(local_50.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_50.disposer,
               (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
               _vptr_AsyncInputStream[-2] +
               (long)&(pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream,OVar2.ptr);
  }
  pAVar1 = local_80.ptr;
  if (local_80.ptr != (AsyncPipe *)0x0) {
    local_80.ptr = (AsyncPipe *)0x0;
    (**((Disposer *)&(local_80.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_80.disposer,
               (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
               _vptr_AsyncInputStream[-2] +
               (long)&(pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream);
  }
  OVar2 = heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
                    ((kj *)&local_80,&local_70,&local_60);
  pAVar1 = local_70.ptr;
  in_RDI->ends[0].disposer = local_40;
  in_RDI->ends[0].ptr = local_38;
  local_38 = (AsyncIoStream *)0x0;
  in_RDI->ends[1].disposer = local_80.disposer;
  in_RDI->ends[1].ptr = (AsyncIoStream *)local_80.ptr;
  if (local_70.ptr != (AsyncPipe *)0x0) {
    local_70.ptr = (AsyncPipe *)0x0;
    (**((Disposer *)&(local_70.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_70.disposer,
               (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
               _vptr_AsyncInputStream[-2] +
               (long)&(pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream,OVar2.ptr);
  }
  pAVar1 = local_60.ptr;
  if (local_60.ptr != (AsyncPipe *)0x0) {
    local_60.ptr = (AsyncPipe *)0x0;
    (**((Disposer *)&(local_60.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_60.disposer,
               (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
               _vptr_AsyncInputStream[-2] +
               (long)&(pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream);
  }
  return in_RDI;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}